

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Warn.cpp
# Opt level: O3

void __thiscall
WarnIRCCommand::trigger
          (WarnIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  uint uVar1;
  IRC_Bot *pIVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  const_iterator cVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  long *plVar15;
  uint __len;
  long *plVar16;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar17;
  string local_f0;
  uint local_cc;
  long *local_c8;
  IRC_Bot *local_c0;
  char *local_b8;
  size_t local_b0;
  size_t local_a8;
  char *local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char *local_78;
  size_t local_70;
  long *local_68;
  long *local_60;
  long local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  pcVar14 = nick._M_str;
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_50,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len," \t","",
             pcVar14);
  if (local_50.second._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,pcVar14,0x39,
               "Error: Too Few Parameters. Syntax: Warn <Player> <Reason>");
  }
  else {
    lVar7 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar7 != 0) {
      local_a8 = nick._M_len;
      local_a0 = pcVar14;
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)&local_68);
      if (local_68 == local_60) {
        Jupiter::IRC::Client::sendMessage
                  (source,channel._M_len,channel._M_str,0x40,
                   "Error: Channel not attached to any connected Renegade X servers.");
      }
      else {
        local_70 = local_50.first._M_len;
        local_78 = local_50.first._M_str;
        local_b0 = local_50.second._M_len;
        local_b8 = local_50.second._M_str;
        local_c8 = local_60;
        plVar15 = local_60;
        plVar16 = local_68;
        local_c0 = source;
        do {
          if ((*plVar16 != 0) &&
             (lVar7 = RenX::Server::getPlayerByPartName(*plVar16,local_70,local_78), lVar7 != 0)) {
            puVar8 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
            lVar9 = Jupiter::Config::operator[](lVar7 + 0x1b8,puVar8[1],*puVar8);
            local_f0._M_dataplus._M_p = (pointer)0x1;
            local_f0._M_string_length = 0x10c013;
            cVar10 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)(lVar9 + 0x28),
                                (basic_string_view<char,_std::char_traits<char>_> *)&local_f0);
            if (cVar10.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              iVar5 = 0;
            }
            else {
              iVar5 = Jupiter_strtoi_s(*(undefined8 *)
                                        ((long)cVar10.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                               ._M_cur + 0x28),
                                       *(undefined8 *)
                                        ((long)cVar10.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                               ._M_cur + 0x30),0);
            }
            pcVar14 = local_a0;
            sVar3 = local_a8;
            uVar17 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
            local_cc = iVar5 + 1;
            if (iVar5 < pluginInstance.m_maxWarns) {
              puVar8 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
              uVar11 = Jupiter::Config::operator[](lVar7 + 0x1b8,puVar8[1],*puVar8);
              uVar1 = -local_cc;
              if (0 < (int)local_cc) {
                uVar1 = local_cc;
              }
              __len = 1;
              if (9 < uVar1) {
                uVar13 = (ulong)uVar1;
                uVar4 = 4;
                do {
                  __len = uVar4;
                  uVar6 = (uint)uVar13;
                  if (uVar6 < 100) {
                    __len = __len - 2;
                    goto LAB_00109af1;
                  }
                  if (uVar6 < 1000) {
                    __len = __len - 1;
                    goto LAB_00109af1;
                  }
                  if (uVar6 < 10000) goto LAB_00109af1;
                  uVar13 = uVar13 / 10000;
                  uVar4 = __len + 4;
                } while (99999 < uVar6);
                __len = __len + 1;
              }
LAB_00109af1:
              iVar5 = (int)local_cc >> 0x1f;
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_construct(&local_98,(ulong)(__len + -iVar5),'-');
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_98._M_dataplus._M_p + (uint)-iVar5,__len,uVar1);
              Jupiter::Config::set(uVar11,1,"w",&local_98);
              pcVar14 = local_a0;
              sVar3 = local_a8;
              uVar1 = local_cc;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              lVar9 = *plVar16;
              in_stack_ffffffffffffff08 = CONCAT44(uVar17,uVar1);
              string_printf_abi_cxx11_
                        (&local_f0,
                         "You have been warned by %.*s@IRC for: %.*s. You have %d warnings.",sVar3,
                         pcVar14,local_b0,local_b8,in_stack_ffffffffffffff08);
              pIVar2 = local_c0;
              RenX::Server::sendWarnMessage
                        (lVar9,lVar7,local_f0._M_string_length,local_f0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              string_printf_abi_cxx11_
                        (&local_f0,"%.*s has been warned; they now have %d warnings.",
                         *(undefined8 *)(lVar7 + 0x10),*(undefined8 *)(lVar7 + 8),(ulong)local_cc);
              Jupiter::IRC::Client::sendNotice
                        (pIVar2,sVar3,pcVar14,local_f0._M_string_length,local_f0._M_dataplus._M_p);
            }
            else {
              lVar9 = *plVar16;
              if (pluginInstance.m_warnAction == -1) {
                string_printf_abi_cxx11_(&local_f0,"Warning limit reached (%d warnings)");
                pIVar2 = local_c0;
                RenX::Server::kickPlayer
                          (lVar9,lVar7,local_f0._M_string_length,local_f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                string_printf_abi_cxx11_
                          (&local_f0,
                           "%.*s has been kicked from the server for exceeding the warning limit (%d warnings)."
                           ,*(undefined8 *)(lVar7 + 0x10),*(undefined8 *)(lVar7 + 8),(ulong)local_cc
                          );
                Jupiter::IRC::Client::sendNotice
                          (pIVar2,sVar3,pcVar14,local_f0._M_string_length,local_f0._M_dataplus._M_p)
                ;
              }
              else {
                string_printf_abi_cxx11_(&local_f0,"Warning limit reached (%d warnings)");
                pIVar2 = local_c0;
                lVar12 = (long)pluginInstance.m_warnAction;
                RenX::Server::banPlayer
                          (lVar9,lVar7,0x15,"Jupiter Bot/RenX.Warn",local_f0._M_string_length,
                           local_f0._M_dataplus._M_p,lVar12);
                uVar17 = (undefined4)((ulong)lVar12 >> 0x20);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                in_stack_ffffffffffffff08 = CONCAT44(uVar17,local_cc);
                string_printf_abi_cxx11_
                          (&local_f0,
                           "%.*s has been banned from the server for exceeding the warning limit (%d warnings)."
                           ,*(undefined8 *)(lVar7 + 0x10),*(undefined8 *)(lVar7 + 8),local_b0,
                           local_b8,in_stack_ffffffffffffff08);
                Jupiter::IRC::Client::sendNotice
                          (pIVar2,sVar3,pcVar14,local_f0._M_string_length,local_f0._M_dataplus._M_p)
                ;
              }
            }
            plVar15 = local_c8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
          }
          plVar16 = plVar16 + 1;
        } while (plVar16 != plVar15);
      }
      if (local_68 != (long *)0x0) {
        operator_delete(local_68,local_58 - (long)local_68);
      }
    }
  }
  return;
}

Assistant:

void WarnIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Warn <Player> <Reason>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	std::string_view name = parameters_split.first;
	std::string_view reason = parameters_split.second;

	RenX::PlayerInfo *player;
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(name);
			if (player != nullptr) {
				int warns = player->varData[pluginInstance.getName()].get<int>(WARNS_KEY) + 1;
				if (warns > pluginInstance.m_maxWarns) {
					switch (pluginInstance.m_warnAction) {
					case -1:
						server->kickPlayer(*player, string_printf("Warning limit reached (%d warnings)", warns));
						source->sendNotice(nick, string_printf("%.*s has been kicked from the server for exceeding the warning limit (%d warnings).", player->name.size(), player->name.data(), warns));
						break;
					default:
						server->banPlayer(*player, "Jupiter Bot/RenX.Warn"sv, string_printf("Warning limit reached (%d warnings)", warns), std::chrono::seconds(pluginInstance.m_warnAction));
						source->sendNotice(nick, string_printf("%.*s has been banned from the server for exceeding the warning limit (%d warnings).", player->name.size(), player->name.data(), reason.size(), reason.data(), warns));
						break;
					}
				}
				else {
					player->varData[pluginInstance.getName()].set(WARNS_KEY, std::to_string(warns));
					server->sendWarnMessage(*player, string_printf("You have been warned by %.*s@IRC for: %.*s. You have %d warnings.", nick.size(),
						nick.data(), reason.size(), reason.data(), warns));
					source->sendNotice(nick, string_printf("%.*s has been warned; they now have %d warnings.", player->name.size(), player->name.data(), warns));
				}
			}
		}
	}
}